

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.h
# Opt level: O2

void __thiscall
Test::Suite::TestMethod::TestMethod(TestMethod *this,string *methodName,SimpleTestMethod method)

{
  undefined8 in_RCX;
  allocator<char> local_19;
  
  std::__cxx11::string::string((string *)this,methodName);
  (this->functor).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->functor)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->functor).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->functor).super__Function_base._M_functor + 8) = 0;
  if (method != 0) {
    *(SimpleTestMethod *)&(this->functor).super__Function_base._M_functor = method;
    *(undefined8 *)((long)&(this->functor).super__Function_base._M_functor + 8) = in_RCX;
    (this->functor)._M_invoker =
         std::_Function_handler<void_(Test::Suite_*),_void_(Test::Suite::*)()>::_M_invoke;
    (this->functor).super__Function_base._M_manager =
         std::_Function_handler<void_(Test::Suite_*),_void_(Test::Suite::*)()>::_M_manager;
  }
  std::__cxx11::string::string
            ((string *)&this->argString,(initializer_list<char>)ZEXT816(0),&local_19);
  return;
}

Assistant:

TestMethod(const std::string &methodName, SimpleTestMethod method) : name(methodName), functor(method), argString({}) {}